

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O3

void MWT::print_scalars(int f,v_array<float> *scalars,v_array<char> *tag)

{
  float *pfVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  ulong uVar5;
  stringstream ss;
  char local_1d8;
  undefined7 uStack_1d7;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pfVar1 = scalars->_begin;
    if (scalars->_end != pfVar1) {
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          local_1d8 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
          pfVar1 = scalars->_begin;
        }
        std::ostream::_M_insert<double>((double)pfVar1[uVar5]);
        uVar5 = uVar5 + 1;
        pfVar1 = scalars->_begin;
      } while (uVar5 < (ulong)((long)scalars->_end - (long)pfVar1 >> 2));
    }
    pcVar2 = tag->_begin;
    if (tag->_end != pcVar2) {
      uVar5 = 0;
      do {
        if (uVar5 == 0) {
          local_1d8 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
          pcVar2 = tag->_begin;
        }
        else {
          pcVar2 = pcVar2 + uVar5;
        }
        local_1d8 = *pcVar2;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
        uVar5 = uVar5 + 1;
        pcVar2 = tag->_begin;
      } while (uVar5 < (ulong)((long)tag->_end - (long)pcVar2));
    }
    local_1d8 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1d8,1);
    std::__cxx11::stringbuf::str();
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    std::__cxx11::stringbuf::str();
    uVar5 = io_buf::write_file_or_socket
                      (f,(void *)CONCAT71(uStack_1d7,local_1d8),local_1d0 & 0xffffffff);
    if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
    }
    if (uVar5 != local_1d0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write error: ",0xd);
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d3a10);
      }
      else {
        sVar4 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void print_scalars(int f, v_array<float>& scalars, v_array<char>& tag)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < scalars.size(); i++)
    {
      if (i > 0)
        ss << ' ';
      ss << scalars[i];
    }
    for (size_t i = 0; i < tag.size(); i++)
    {
      if (i == 0)
        ss << ' ';
      ss << tag[i];
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}